

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O0

void __thiscall EnrichableAnalyzerSubprocess::Start(EnrichableAnalyzerSubprocess *this)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  long lVar4;
  int *piVar5;
  char *__words;
  int local_fc;
  char *pcStack_f8;
  int i;
  char *args [25];
  undefined1 local_28 [8];
  wordexp_t cmdParsed;
  EnrichableAnalyzerSubprocess *this_local;
  
  cmdParsed.we_offs = (size_t)this;
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    std::operator<<((ostream *)&std::cerr,"No parser command defined; aborting subprocess.\n");
    Terminate(this);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Starting analyzer subprocess: ");
    std::operator<<((ostream *)&std::cerr,(string *)&this->parserCommand);
    std::operator<<((ostream *)&std::cerr,"\n");
  }
  iVar2 = pipe(this->inpipefd);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to create input pipe: ");
    piVar5 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar5);
    std::operator<<((ostream *)&std::cerr,"\n");
    Terminate(this);
  }
  iVar2 = pipe(this->outpipefd);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to create output pipe: ");
    piVar5 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar5);
    std::operator<<((ostream *)&std::cerr,"\n");
    Terminate(this);
  }
  std::operator<<((ostream *)&std::cerr,"Starting fork...\n");
  _Var3 = fork();
  this->commandPid = _Var3;
  if (this->commandPid == 0) {
    std::operator<<((ostream *)&std::cerr,"Forked...\n");
    iVar2 = dup2(this->outpipefd[0],0);
    if (iVar2 < 0) {
      std::operator<<((ostream *)&std::cerr,"Failed to redirect STDIN: ");
      piVar5 = __errno_location();
      std::ostream::operator<<((ostream *)&std::cerr,*piVar5);
      std::operator<<((ostream *)&std::cerr,"\n");
      piVar5 = __errno_location();
      exit(*piVar5);
    }
    iVar2 = dup2(this->inpipefd[1],1);
    if (iVar2 < 0) {
      std::operator<<((ostream *)&std::cerr,"Failed to redirect STDOUT: ");
      piVar5 = __errno_location();
      std::ostream::operator<<((ostream *)&std::cerr,*piVar5);
      std::operator<<((ostream *)&std::cerr,"\n");
      piVar5 = __errno_location();
      exit(*piVar5);
    }
    __words = (char *)std::__cxx11::string::c_str();
    wordexp(__words,(wordexp_t *)local_28,0);
    for (local_fc = 0; (ulong)(long)local_fc < (ulong)local_28; local_fc = local_fc + 1) {
      args[(long)local_fc + -1] = *(char **)(cmdParsed.we_wordc + (long)local_fc * 8);
    }
    args[(long)local_fc + -1] = (char *)0x0;
    close(this->inpipefd[0]);
    close(this->inpipefd[1]);
    close(this->outpipefd[0]);
    close(this->outpipefd[1]);
    execvp(pcStack_f8,&stack0xffffffffffffff08);
    std::operator<<((ostream *)&std::cerr,"Failed to spawn analyzer subprocess!\n");
  }
  else {
    close(this->inpipefd[1]);
    close(this->outpipefd[0]);
  }
  bVar1 = GetFeatureEnablement(this,"bubble");
  this->featureBubble = bVar1;
  bVar1 = GetFeatureEnablement(this,"marker");
  this->featureMarker = bVar1;
  bVar1 = GetFeatureEnablement(this,"tabular");
  this->featureTabular = bVar1;
  return;
}

Assistant:

void EnrichableAnalyzerSubprocess::Start() {
	if(!parserCommand.length()) {
		std::cerr << "No parser command defined; aborting subprocess.\n";
		Terminate();
	} else {
		std::cerr << "Starting analyzer subprocess: ";
		std::cerr << parserCommand;
		std::cerr << "\n";
	}


	if(pipe(inpipefd) < 0) {
		std::cerr << "Failed to create input pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	if(pipe(outpipefd) < 0) {
		std::cerr << "Failed to create output pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	std::cerr << "Starting fork...\n";
	commandPid = fork();

	if(commandPid == 0) {
		std::cerr << "Forked...\n";
		if(dup2(outpipefd[0], STDIN_FILENO) < 0) {
			std::cerr << "Failed to redirect STDIN: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}
		if(dup2(inpipefd[1], STDOUT_FILENO) < 0) {
			std::cerr << "Failed to redirect STDOUT: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}

		wordexp_t cmdParsed;
		char *args[25];

		wordexp(parserCommand.c_str(), &cmdParsed, 0);
		int i;
		for(i = 0; i < cmdParsed.we_wordc; i++) {
			args[i] = cmdParsed.we_wordv[i];
		}
		args[i] = (char*)NULL;

		close(inpipefd[0]);
		close(inpipefd[1]);
		close(outpipefd[0]);
		close(outpipefd[1]);

		execvp(args[0], args);

		std::cerr << "Failed to spawn analyzer subprocess!\n";
	} else {
		close(inpipefd[1]);
		close(outpipefd[0]);
	}

	// Check script to see which features are enabled;
	// * 'no': This feature can be skipped.  This is used to improve
	//   performance by allowing the script to not receive messages for
	//   features it does not support.
	// * 'yes': Send messages of this type.
	// * Anything else: Send messages of this type.  This might be surprising,
	//   but it's more important to me that the default case be simple
	//   than the default case be high-performance.   Scripts are expected
	//   to respond to even unhandled messages.
	featureBubble = GetFeatureEnablement(BUBBLE_PREFIX);
	featureMarker = GetFeatureEnablement(MARKER_PREFIX);
	featureTabular = GetFeatureEnablement(TABULAR_PREFIX);
}